

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

ArchKind llvm::AArch64::parseArch(StringRef Arch)

{
  uint uVar1;
  int iVar2;
  size_t in_RDX;
  ulong __n;
  long lVar3;
  StringRef Arch_00;
  StringRef SVar4;
  
  SVar4.Data = (char *)Arch.Length;
  SVar4.Length = in_RDX;
  SVar4 = ARM::getCanonicalArchName((ARM *)Arch.Data,SVar4);
  Arch_00.Length = (char *)SVar4.Length;
  Arch_00.Data = Arch_00.Length;
  uVar1 = checkArchVersion((AArch64 *)SVar4.Data,Arch_00);
  if (7 < uVar1) {
    SVar4 = getArchSynonym(SVar4);
    __n = SVar4.Length;
    for (lVar3 = 0; lVar3 != 0x180; lVar3 = lVar3 + 0x40) {
      if ((__n <= *(ulong *)(&DAT_001ddf58 + lVar3)) &&
         ((__n == 0 ||
          (iVar2 = bcmp((void *)((*(ulong *)(&DAT_001ddf58 + lVar3) +
                                 *(long *)((long)&(anonymous_namespace)::AArch64ARCHNames + lVar3))
                                - __n),SVar4.Data,__n), iVar2 == 0)))) {
        return *(ArchKind *)((long)&DAT_001ddf88 + lVar3);
      }
    }
  }
  return INVALID;
}

Assistant:

StringRef llvm::AArch64::getCanonicalArchName(StringRef Arch) {
  return ARM::getCanonicalArchName(Arch);
}